

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O2

int __thiscall LPCMStreamReader::convertWavToPCM(LPCMStreamReader *this,uint8_t *start,uint8_t *end)

{
  uint16_t *end_00;
  uint8_t uVar1;
  ushort uVar2;
  int iVar3;
  ushort uVar4;
  byte bVar5;
  uint16_t uVar6;
  uint8_t *tmpData;
  uint8_t *curPos_1;
  ulong uVar7;
  uint16_t *puVar8;
  byte bVar9;
  uint uVar10;
  size_t __n;
  long lVar11;
  size_t __n_00;
  uint16_t *curPos;
  
  uVar2 = this->m_bitsPerSample;
  __n = 3;
  if (uVar2 != 0x14) {
    __n = (size_t)(uVar2 >> 3);
  }
  __n_00 = __n * this->m_channels;
  uVar7 = (long)end - (long)start;
  if ((long)uVar7 < (long)__n_00) {
    return 0;
  }
  uVar7 = uVar7 - uVar7 % __n_00;
  end_00 = (uint16_t *)(start + uVar7);
  uVar7 = uVar7 / this->m_channels;
  puVar8 = (uint16_t *)start;
  if (uVar2 == 0x10) {
    for (; puVar8 < end_00; puVar8 = puVar8 + 1) {
      uVar6 = my_ntohs(*puVar8);
      *puVar8 = uVar6;
    }
  }
  else if (0x10 < uVar2) {
    for (; puVar8 < end_00 + -1; puVar8 = (uint16_t *)((long)puVar8 + 3)) {
      uVar6 = *puVar8;
      *(uint8_t *)puVar8 = (uint8_t)puVar8[1];
      *(uint8_t *)(puVar8 + 1) = (uint8_t)uVar6;
    }
  }
  uVar1 = this->m_channels;
  if (uVar1 == '\b') {
    tmpData = (uint8_t *)operator_new__(uVar7);
    storeChannelData(this,start,(uint8_t *)end_00,4,tmpData,8);
    copyChannelData(this,start,(uint8_t *)end_00,7,4,(uint)this->m_channels);
    copyChannelData(this,start,(uint8_t *)end_00,8,7,(uint)this->m_channels);
    restoreChannelData(this,start,(uint8_t *)end_00,8,tmpData,(uint)this->m_channels);
  }
  else {
    if (uVar1 == '\a') {
      tmpData = (uint8_t *)operator_new__(uVar7);
      storeChannelData(this,start,(uint8_t *)end_00,4,tmpData,7);
      copyChannelData(this,start,(uint8_t *)end_00,6,4,(uint)this->m_channels);
      copyChannelData(this,start,(uint8_t *)end_00,5,6,(uint)this->m_channels);
      bVar5 = this->m_channels;
      iVar3 = 5;
    }
    else {
      if (uVar1 != '\x06') goto LAB_001a506b;
      tmpData = (uint8_t *)operator_new__(uVar7);
      storeChannelData(this,start,(uint8_t *)end_00,4,tmpData,6);
      copyChannelData(this,start,(uint8_t *)end_00,5,4,(uint)this->m_channels);
      copyChannelData(this,start,(uint8_t *)end_00,6,5,(uint)this->m_channels);
      bVar5 = this->m_channels;
      iVar3 = 6;
    }
    restoreChannelData(this,start,(uint8_t *)end_00,iVar3,tmpData,(uint)bVar5);
  }
  operator_delete__(tmpData);
LAB_001a506b:
  lVar11 = (ulong)this->m_needPCMHdr * 4 + 0xdf;
  for (; start < end_00; start = (uint8_t *)((long)start + __n_00)) {
    memcpy((void *)((long)&(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                           super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader + lVar11),
           start,__n_00);
    lVar11 = lVar11 + __n_00;
    if ((this->m_channels & 1) != 0) {
      memset((void *)((long)&(this->super_SimplePacketizerReader).super_AbstractStreamReader.
                             super_BaseAbstractStreamReader._vptr_BaseAbstractStreamReader + lVar11)
             ,0,__n);
      lVar11 = lVar11 + __n;
    }
  }
  if (lVar11 < 0x4463) {
    if (this->m_needPCMHdr == true) {
      uVar2 = this->m_bitsPerSample;
      uVar10 = 0x18;
      if (uVar2 != 0x14) {
        uVar10 = (uint)uVar2;
      }
      iVar3 = this->m_freq;
      uVar4 = (ushort)((int)((uint)(this->m_channels + 1 & 0xfe) * uVar10 * iVar3) / 0x640);
      *(ushort *)this->m_tmpFrameBuffer = uVar4 << 8 | uVar4 >> 8;
      switch(this->m_channels) {
      case '\x02':
        bVar5 = 3;
        break;
      case '\x03':
        bVar5 = this->m_lfeExists | 4;
        break;
      case '\x04':
        bVar5 = this->m_lfeExists ^ 7;
        break;
      case '\x05':
        bVar5 = 8;
        break;
      case '\x06':
        bVar5 = 9;
        break;
      case '\a':
        bVar5 = 10;
        break;
      case '\b':
        bVar5 = 0xb;
        break;
      default:
        bVar5 = 1;
      }
      bVar9 = (iVar3 == 0x2ee00) * '\x04' + 1;
      if (iVar3 == 96000) {
        bVar9 = 4;
      }
      this->m_tmpFrameBuffer[2] = bVar5 << 4 | bVar9;
      this->m_tmpFrameBuffer[3] = (char)((int)(uVar2 - 0xc) / 4) << 6 | this->m_firstFrame << 5;
    }
    return (int)lVar11 + -0xdf;
  }
  __assert_fail("dst < m_tmpFrameBuffer + sizeof(m_tmpFrameBuffer)",
                "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/lpcmStreamReader.cpp"
                ,0xf7,"int LPCMStreamReader::convertWavToPCM(uint8_t *, uint8_t *)");
}

Assistant:

int LPCMStreamReader::convertWavToPCM(uint8_t* start, uint8_t* end)
{
    // int mch = m_channels; // + (m_channels%2==1 ? 1 : 0);
    const int ch1SampleSize = (m_bitsPerSample == 20 ? 3 : m_bitsPerSample / 8);
    const int fullSampleSize = m_channels * ch1SampleSize;
    if (end - start < fullSampleSize)
        return 0;
    int64_t cLen = end - start;
    cLen -= cLen % fullSampleSize;
    end = start + cLen;

    const int64_t ch1FullSize = (end - start) / m_channels;
    // 1. convert byte order to little endian
    if (m_bitsPerSample == 16)
    {
        for (auto curPos = reinterpret_cast<uint16_t*>(start); curPos < reinterpret_cast<uint16_t*>(end); ++curPos)
            *curPos = my_htons(*curPos);
    }
    else if (m_bitsPerSample > 16)
    {
        for (uint8_t* curPos = start; curPos < end - 2; curPos += 3)
        {
            const uint8_t tmp = curPos[0];
            curPos[0] = curPos[2];
            curPos[2] = tmp;
        }
    }
    // 2. Remap channels to Blu-ray standard
    if (m_channels == 6)
    {
        const auto tmpData = new uint8_t[ch1FullSize];
        storeChannelData(start, end, 4, tmpData, m_channels);    // copy channel 6(LFE) to tmpData
        copyChannelData(start, end, 5, 4, m_channels);           // Shift RS
        copyChannelData(start, end, 6, 5, m_channels);           // Shift LS
        restoreChannelData(start, end, 6, tmpData, m_channels);  // copy LFE to channel #4
        delete[] tmpData;
    }
    else if (m_channels == 7)
    {
        const auto tmpData = new uint8_t[ch1FullSize];

        storeChannelData(start, end, 4, tmpData, m_channels);  // copy channel 8(LFE) to tmpData
        copyChannelData(start, end, 6, 4, m_channels);
        copyChannelData(start, end, 5, 6, m_channels);
        restoreChannelData(start, end, 5, tmpData, m_channels);

        delete[] tmpData;
    }
    else if (m_channels == 8)
    {
        const auto lfeData = new uint8_t[ch1FullSize];

        storeChannelData(start, end, 4, lfeData, m_channels);  // copy channel 8(LFE) to tmpData
        copyChannelData(start, end, 7, 4, m_channels);
        copyChannelData(start, end, 8, 7, m_channels);
        restoreChannelData(start, end, 8, lfeData, m_channels);

        delete[] lfeData;
    }
    // 3. transfer to frame buffer and Add X channel (zero channel for padding if needed)
    uint8_t* dst = m_tmpFrameBuffer + (m_needPCMHdr ? 4 : 0);
    const uint8_t* src = start;
    for (; src < end; src += fullSampleSize)
    {
        memcpy(dst, src, fullSampleSize);
        dst += fullSampleSize;
        if (m_channels % 2 == 1)
        {
            memset(dst, 0, ch1SampleSize);
            dst += ch1SampleSize;
        }
    }
    assert(dst < m_tmpFrameBuffer + sizeof(m_tmpFrameBuffer));
    // 4. add LPCM frame header
    if (m_needPCMHdr)
    {
        const int audio_data_payload_size = (m_bitsPerSample == 20 ? 24 : m_bitsPerSample) * m_freq *
                                            ((m_channels + 1) & 0xfe) / 8 / 200;  // 5 ms frame len. 1000/5 = 200
        // int audio_data_payload_size = dst - (m_tmpFrameBuffer + 4);
        m_tmpFrameBuffer[0] = static_cast<uint8_t>(audio_data_payload_size >> 8);
        m_tmpFrameBuffer[1] = audio_data_payload_size & 0xff;
        int channelsIndex = 1;
        switch (m_channels)
        {
        case 2:
            channelsIndex = 3;
            break;
        case 3:
            channelsIndex = 4 + (m_lfeExists ? 1 : 0);
            break;
        case 4:
            channelsIndex = 6 + (m_lfeExists ? 0 : 1);
            break;
        case 5:
            channelsIndex = 8;
            break;
        case 6:
            channelsIndex = 9;
            break;
        case 7:
            channelsIndex = 10;
            break;
        case 8:
            channelsIndex = 11;
            break;
        default:;
        }
        int sampling_index = 1;
        if (m_freq == 96000)
            sampling_index = 4;
        else if (m_freq == 192000)
            sampling_index = 5;
        m_tmpFrameBuffer[2] = (channelsIndex << 4 | sampling_index) & 0xff;
        const int bits_per_sample = (m_bitsPerSample - 12) / 4;
        m_tmpFrameBuffer[3] = (bits_per_sample << 6 | m_firstFrame << 5) & 0xff;
    }
    return static_cast<int>(dst - m_tmpFrameBuffer);
}